

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

bool __thiscall cmsys::RegularExpression::compile(RegularExpression *this,char *exp)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  ulong local_60;
  size_t len;
  RegExpCompile comp;
  char *pcStack_30;
  int flags;
  char *longest;
  char *scan;
  char *exp_local;
  RegularExpression *this_local;
  
  if (exp == (char *)0x0) {
    printf("RegularExpression::compile(): No expression supplied.\n");
    this_local._7_1_ = false;
  }
  else {
    comp.regparse._0_4_ = 1;
    comp.regcode = (char *)0x0;
    comp._8_8_ = &regdummy;
    len = (size_t)exp;
    RegExpCompile::regc((RegExpCompile *)&len,-100);
    pcVar1 = RegExpCompile::reg((RegExpCompile *)&len,0,(int *)((long)&comp.regsize + 4));
    if (pcVar1 == (char *)0x0) {
      printf("RegularExpression::compile(): Error in compile.\n");
      this_local._7_1_ = false;
    }
    else {
      RegularExpressionMatch::clear(&this->regmatch);
      if ((long)comp.regcode < 0xffff) {
        if (this->program != (char *)0x0) {
          operator_delete__(this->program);
        }
        pcVar1 = (char *)operator_new__((ulong)comp.regcode);
        this->program = pcVar1;
        this->progsize = (int)comp.regcode;
        if (this->program == (char *)0x0) {
          printf("RegularExpression::compile(): Out of memory.\n");
          this_local._7_1_ = false;
        }
        else {
          comp.regparse._0_4_ = 1;
          comp._8_8_ = this->program;
          len = (size_t)exp;
          RegExpCompile::regc((RegExpCompile *)&len,-100);
          RegExpCompile::reg((RegExpCompile *)&len,0,(int *)((long)&comp.regsize + 4));
          this->regstart = '\0';
          this->reganch = '\0';
          this->regmust = (char *)0x0;
          this->regmlen = 0;
          pcVar1 = this->program;
          pcVar2 = regnext(pcVar1 + 1);
          if (*pcVar2 == '\0') {
            longest = pcVar1 + 4;
            if (*longest == '\b') {
              this->regstart = pcVar1[7];
            }
            else if (*longest == '\x01') {
              this->reganch = this->reganch + '\x01';
            }
            if ((comp.regsize._4_4_ & 4) != 0) {
              pcStack_30 = (char *)0x0;
              local_60 = 0;
              for (; longest != (char *)0x0; longest = regnext(longest)) {
                if ((*longest == '\b') && (sVar3 = strlen(longest + 3), local_60 <= sVar3)) {
                  pcStack_30 = longest + 3;
                  local_60 = strlen(longest + 3);
                }
              }
              this->regmust = pcStack_30;
              this->regmlen = local_60;
            }
          }
          this_local._7_1_ = true;
        }
      }
      else {
        printf("RegularExpression::compile(): Expression too big.\n");
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RegularExpression::compile(const char* exp)
{
  const char* scan;
  const char* longest;
  int flags;

  if (exp == nullptr) {
    // RAISE Error, SYM(RegularExpression), SYM(No_Expr),
    printf("RegularExpression::compile(): No expression supplied.\n");
    return false;
  }

  // First pass: determine size, legality.
  RegExpCompile comp;
  comp.regparse = exp;
  comp.regnpar = 1;
  comp.regsize = 0L;
  comp.regcode = regdummyptr;
  comp.regc(static_cast<char>(MAGIC));
  if (!comp.reg(0, &flags)) {
    printf("RegularExpression::compile(): Error in compile.\n");
    return false;
  }
  this->regmatch.clear();

  // Small enough for pointer-storage convention?
  if (comp.regsize >= 65535L) {
    // RAISE Error, SYM(RegularExpression), SYM(Expr_Too_Big),
    printf("RegularExpression::compile(): Expression too big.\n");
    return false;
  }

  // Allocate space.
  // #ifndef _WIN32
  delete[] this->program;
  // #endif
  this->program = new char[comp.regsize];
  this->progsize = static_cast<int>(comp.regsize);

  if (this->program == nullptr) {
    // RAISE Error, SYM(RegularExpression), SYM(Out_Of_Memory),
    printf("RegularExpression::compile(): Out of memory.\n");
    return false;
  }

#ifdef __clang_analyzer__ /* Convince it that the program is initialized.  */
  memset(this->program, 0, comp.regsize);
#endif

  // Second pass: emit code.
  comp.regparse = exp;
  comp.regnpar = 1;
  comp.regcode = this->program;
  comp.regc(static_cast<char>(MAGIC));
  comp.reg(0, &flags);

  // Dig out information for optimizations.
  this->regstart = '\0'; // Worst-case defaults.
  this->reganch = 0;
  this->regmust = nullptr;
  this->regmlen = 0;
  scan = this->program + 1;       // First BRANCH.
  if (OP(regnext(scan)) == END) { // Only one top-level choice.
    scan = OPERAND(scan);

    // Starting-point info.
    if (OP(scan) == EXACTLY)
      this->regstart = *OPERAND(scan);
    else if (OP(scan) == BOL)
      this->reganch++;

    //
    // If there's something expensive in the r.e., find the longest
    // literal string that must appear and make it the regmust.  Resolve
    // ties in favor of later strings, since the regstart check works
    // with the beginning of the r.e. and avoiding duplication
    // strengthens checking.  Not a strong reason, but sufficient in the
    // absence of others.
    //
    if (flags & SPSTART) {
      longest = nullptr;
      size_t len = 0;
      for (; scan != nullptr; scan = regnext(scan))
        if (OP(scan) == EXACTLY && strlen(OPERAND(scan)) >= len) {
          longest = OPERAND(scan);
          len = strlen(OPERAND(scan));
        }
      this->regmust = longest;
      this->regmlen = len;
    }
  }
  return true;
}